

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformtheme.cpp
# Opt level: O2

QVariant * QPlatformTheme::defaultThemeHint(QVariant *__return_storage_ptr__,ThemeHint hint)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  long in_FS_OFFSET;
  initializer_list<Qt::Key> args;
  bool ok;
  bool ok_1;
  undefined8 uStack_40;
  undefined8 local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  switch(hint) {
  case CursorFlashTime:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      iVar1 = 1000;
LAB_002db7d2:
      ::QVariant::QVariant(__return_storage_ptr__,iVar1);
      return __return_storage_ptr__;
    }
    break;
  case KeyboardInputInterval:
  case MouseDoubleClickInterval:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      iVar1 = 400;
      goto LAB_002db7d2;
    }
    break;
  case StartDragDistance:
  case MouseQuickSelectionThreshold:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      iVar1 = 10;
      goto LAB_002db7d2;
    }
    break;
  case StartDragTime:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      iVar1 = 500;
      goto LAB_002db7d2;
    }
    break;
  case KeyboardAutoRepeatRate:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      iVar1 = 0x1e;
      goto LAB_002db7d2;
    }
    break;
  case PasswordMaskDelay:
  case StartDragVelocity:
  case ToolButtonStyle:
  case ToolBarIconSize:
  case DialogButtonBoxLayout:
  case KeyboardScheme:
  case UiEffects:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      iVar1 = 0;
      goto LAB_002db7d2;
    }
    break;
  case TextCursorWidth:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      iVar1 = 1;
      goto LAB_002db7d2;
    }
    break;
  case DropShadow:
  case ItemViewActivateItemOnSingleClick:
  case WindowAutoPlacement:
  case DialogButtonBoxButtonsHaveIcons:
  case UseFullScreenForPopupMenu:
  case DialogSnapToDefaultButton:
  case ContextMenuOnMouseRelease:
  case PreselectFirstFileInDirectory:
  case SetFocusOnTouchRelease:
  case MenuBarFocusOnAltPressRelease:
  case PreferFileIconFromTheme:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      bVar3 = false;
LAB_002db542:
      ::QVariant::QVariant(__return_storage_ptr__,bVar3);
      return __return_storage_ptr__;
    }
    break;
  case MaximumScrollBarDragDistance:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      iVar1 = -1;
      goto LAB_002db7d2;
    }
    break;
  case SystemIconThemeName:
  case SystemIconFallbackThemeName:
  case MouseCursorTheme:
    _ok_1 = (PrivateShared *)0x0;
    uStack_40 = (QString *)0x0;
    local_38 = 0;
    ::QVariant::QVariant(__return_storage_ptr__,(QString *)&ok_1);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&ok_1);
    goto LAB_002db83e;
  case IconThemeSearchPaths:
  case StyleNames:
  case IconFallbackSearchPaths:
    _ok_1 = (PrivateShared *)0x0;
    uStack_40 = (QString *)0x0;
    local_38 = 0;
    ::QVariant::QVariant(__return_storage_ptr__,(QList_conflict1 *)&ok_1);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&ok_1);
    goto LAB_002db83e;
  case SpellCheckUnderlineStyle:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      iVar1 = 6;
      goto LAB_002db7d2;
    }
    break;
  case TabFocusBehavior:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      iVar1 = 0xff;
      goto LAB_002db7d2;
    }
    break;
  case IconPixmapSizes:
    _ok_1 = (PrivateShared *)0x0;
    uStack_40 = (QString *)0x0;
    local_38 = 0;
    ::QVariant::fromValue<QList<int>,_true>(__return_storage_ptr__,(QList<int> *)&ok_1);
    QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&ok_1);
    goto LAB_002db83e;
  case PasswordMaskCharacter:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      ::QVariant::QVariant(__return_storage_ptr__,(QChar)0x25cf);
      return __return_storage_ptr__;
    }
    break;
  case MousePressAndHoldInterval:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      iVar1 = 800;
      goto LAB_002db7d2;
    }
    break;
  case MouseDoubleClickDistance:
    _ok_1 = _ok_1 & 0xffffffffffffff00;
    iVar2 = qEnvironmentVariableIntValue("QT_DBL_CLICK_DIST",&ok_1);
    iVar1 = 5;
    if (ok_1 != false) {
      iVar1 = iVar2;
    }
    goto LAB_002db7fe;
  case WheelScrollLines:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      iVar1 = 3;
      goto LAB_002db7d2;
    }
    break;
  case TouchDoubleTapDistance:
    _ok = _ok & 0xffffffffffffff00;
    iVar1 = qEnvironmentVariableIntValue("QT_DBL_TAP_DIST",&ok);
    if (ok == false) {
      defaultThemeHint((QVariant *)&ok_1,MouseDoubleClickDistance);
      iVar2 = ::QVariant::toInt(&ok_1);
      ::QVariant::~QVariant((QVariant *)&ok_1);
      iVar1 = 10;
      if ((_ok & 1) != 0) {
        iVar1 = iVar2 * 2;
      }
    }
LAB_002db7fe:
    ::QVariant::QVariant(__return_storage_ptr__,iVar1);
    goto LAB_002db83e;
  case ShowShortcutsInContextMenus:
  case InteractiveResizeAcrossScreens:
  case ShowDirectoriesFirst:
  case UnderlineShortcut:
  case ShowIconsInMenus:
  case MenuSelectionWraps:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      bVar3 = true;
      goto LAB_002db542;
    }
    break;
  case ButtonPressKeys:
    _ok = 0x101000000000020;
    args._M_len = 2;
    args._M_array = (iterator)&ok;
    QList<Qt::Key>::QList((QList<Qt::Key> *)&ok_1,args);
    ::QVariant::fromValue<QList<Qt::Key>,_true>(__return_storage_ptr__,(QList<Qt::Key> *)&ok_1);
    QArrayDataPointer<Qt::Key>::~QArrayDataPointer((QArrayDataPointer<Qt::Key> *)&ok_1);
    goto LAB_002db83e;
  case FlickStartDistance:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      iVar1 = 0xf;
      goto LAB_002db7d2;
    }
    break;
  case FlickMaximumVelocity:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      iVar1 = 0x9c4;
      goto LAB_002db7d2;
    }
    break;
  case FlickDeceleration:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      iVar1 = 0x5dc;
      goto LAB_002db7d2;
    }
    break;
  case MouseCursorSize:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      ::QVariant::QVariant(__return_storage_ptr__,(QSize)0x1000000010);
      return __return_storage_ptr__;
    }
    break;
  default:
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
LAB_002db83e:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QVariant QPlatformTheme::defaultThemeHint(ThemeHint hint)
{
    switch (hint) {
    case QPlatformTheme::CursorFlashTime:
        return QVariant(1000);
    case QPlatformTheme::KeyboardInputInterval:
        return QVariant(400);
    case QPlatformTheme::KeyboardAutoRepeatRate:
        return QVariant(30);
    case QPlatformTheme::MouseDoubleClickInterval:
        return QVariant(400);
    case QPlatformTheme::StartDragDistance:
        return QVariant(10);
    case QPlatformTheme::StartDragTime:
        return QVariant(500);
    case QPlatformTheme::PasswordMaskDelay:
        return QVariant(int(0));
    case QPlatformTheme::PasswordMaskCharacter:
        return QVariant(QChar(u'\x25CF'));
    case QPlatformTheme::StartDragVelocity:
        return QVariant(int(0)); // no limit
    case QPlatformTheme::UseFullScreenForPopupMenu:
        return QVariant(false);
    case QPlatformTheme::WindowAutoPlacement:
        return QVariant(false);
    case QPlatformTheme::DialogButtonBoxLayout:
        return QVariant(int(0));
    case QPlatformTheme::DialogButtonBoxButtonsHaveIcons:
        return QVariant(false);
    case QPlatformTheme::ItemViewActivateItemOnSingleClick:
        return QVariant(false);
    case QPlatformTheme::ToolButtonStyle:
        return QVariant(int(Qt::ToolButtonIconOnly));
    case QPlatformTheme::ToolBarIconSize:
        return QVariant(int(0));
    case QPlatformTheme::SystemIconThemeName:
    case QPlatformTheme::SystemIconFallbackThemeName:
        return QVariant(QString());
    case QPlatformTheme::IconThemeSearchPaths:
        return QVariant(QStringList());
    case QPlatformTheme::IconFallbackSearchPaths:
        return QVariant(QStringList());
    case QPlatformTheme::StyleNames:
        return QVariant(QStringList());
    case QPlatformTheme::ShowShortcutsInContextMenus:
        return QVariant(true);
    case TextCursorWidth:
        return QVariant(1);
    case DropShadow:
        return QVariant(false);
    case MaximumScrollBarDragDistance:
        return QVariant(-1);
    case KeyboardScheme:
        return QVariant(int(WindowsKeyboardScheme));
    case UiEffects:
        return QVariant(int(0));
    case SpellCheckUnderlineStyle:
        return QVariant(int(QTextCharFormat::WaveUnderline));
    case TabFocusBehavior:
        return QVariant(int(Qt::TabFocusAllControls));
    case IconPixmapSizes:
        return QVariant::fromValue(QList<int>());
    case DialogSnapToDefaultButton:
    case ContextMenuOnMouseRelease:
        return QVariant(false);
    case MousePressAndHoldInterval:
        return QVariant(800);
    case MouseDoubleClickDistance:
        {
            bool ok = false;
            const int dist = qEnvironmentVariableIntValue("QT_DBL_CLICK_DIST", &ok);
            return QVariant(ok ? dist : 5);
        }
    case WheelScrollLines:
        return QVariant(3);
    case TouchDoubleTapDistance:
        {
            bool ok = false;
            int dist = qEnvironmentVariableIntValue("QT_DBL_TAP_DIST", &ok);
            if (!ok)
                dist = defaultThemeHint(MouseDoubleClickDistance).toInt(&ok) * 2;
            return QVariant(ok ? dist : 10);
        }
    case MouseQuickSelectionThreshold:
        return QVariant(10);
    case InteractiveResizeAcrossScreens:
        return true;
    case ShowDirectoriesFirst:
        return true;
    case PreselectFirstFileInDirectory:
        return false;
    case ButtonPressKeys:
        return QVariant::fromValue(QList<Qt::Key>({ Qt::Key_Space, Qt::Key_Select }));
    case SetFocusOnTouchRelease:
        return false;
    case FlickStartDistance:
        return QVariant(15);
    case FlickMaximumVelocity:
        return QVariant(2500);
    case FlickDeceleration:
        return QVariant(1500);
    case MenuBarFocusOnAltPressRelease:
        return false;
    case MouseCursorTheme:
        return QVariant(QString());
    case MouseCursorSize:
        return QVariant(QSize(16, 16));
    case UnderlineShortcut:
        return true;
    case ShowIconsInMenus:
        return true;
    case PreferFileIconFromTheme:
        return false;
    case MenuSelectionWraps:
        return true;
    }

    return QVariant();
}